

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Minefield_Query_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Query_PDU *this)

{
  pointer pPVar1;
  ushort *puVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  ushort *puVar4;
  pointer pPVar5;
  KStringStream ss;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_258,(Header7 *)this);
  poVar3 = std::operator<<(local_1a8,(string *)&local_258);
  poVar3 = std::operator<<(poVar3,"-Minefield Query PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_278,&this->super_Minefield_Header);
  poVar3 = std::operator<<(poVar3,(string *)&local_278);
  poVar3 = std::operator<<(poVar3,"Requesting ID:           ");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_ReqID);
  UTILS::IndentString(&local_1d8,&local_1f8,Tabs,in_CL);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"Request ID:              ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8ReqID);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of Permim Points: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumPerimPoints);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of Sensor Types:  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumSensTyp);
  poVar3 = std::operator<<(poVar3,"\n");
  DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_(&local_218,&this->m_DataFilter);
  poVar3 = std::operator<<(poVar3,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"Mine Type Filter:        ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_238,&this->m_MineTypFilter);
  poVar3 = std::operator<<(poVar3,(string *)&local_238);
  std::operator<<(poVar3,"Perimeter Points:\n");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  pPVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar5 = (this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
    (*(pPVar5->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_278,pPVar5);
    UTILS::IndentString(&local_258,&local_278,Tabs_00,in_CL);
    std::operator<<(local_1a8,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
  }
  std::operator<<(local_1a8,"Sensor Types:\n");
  puVar2 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    poVar3 = std::operator<<(local_1a8,"\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar4);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Query_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Query PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting ID:           " << IndentString( m_ReqID.GetAsString(), 1 )
       << "Request ID:              " << ( KUINT16 )m_ui8ReqID          << "\n"
       << "Number Of Permim Points: " << ( KUINT16 )m_ui8NumPerimPoints << "\n"
       << "Number Of Sensor Types:  " << ( KUINT16 )m_ui8NumSensTyp     << "\n"
       << m_DataFilter.GetAsString()
       << "Mine Type Filter:        " << m_MineTypFilter.GetAsString()
       << "Perimeter Points:\n";

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        ss << IndentString( citrPnt->GetAsString(), 1 );
    }

    ss << "Sensor Types:\n";

    std::vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    std::vector<KUINT16>::const_iterator citrEndSt = m_vui16SensorTypes.end();
    for( ; citrSt != citrEndSt; ++citrSt )
    {
        ss << "\t" << *citrSt << "\n";
    }

    return ss.str();
}